

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_merge_sort_tree.cpp
# Opt level: O2

void __thiscall duckdb::WindowMergeSortTreeLocalState::Sort(WindowMergeSortTreeLocalState *this)

{
  bool bVar1;
  
  while ((this->window_tree->build_stage)._M_i != FINISHED) {
    bVar1 = WindowMergeSortTree::TryPrepareSortStage(this->window_tree,this);
    if (bVar1) {
      ExecuteSortTask(this);
    }
    else {
      sched_yield();
    }
  }
  return;
}

Assistant:

void WindowMergeSortTreeLocalState::Sort() {
	// Sort, merge and build the tree in parallel
	while (window_tree.build_stage.load() != PartitionSortStage::FINISHED) {
		if (window_tree.TryPrepareSortStage(*this)) {
			ExecuteSortTask();
		} else {
			std::this_thread::yield();
		}
	}
}